

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorWell::mousePressEvent(QColorWell *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (this->super_QWellArray).selCol;
  (this->oldCurrent).xp = (Representation)(this->super_QWellArray).selRow;
  (this->oldCurrent).yp = (Representation)iVar1;
  QWellArray::mousePressEvent(&this->super_QWellArray,e);
  this->mousePressed = true;
  local_28 = QSinglePointEvent::position((QSinglePointEvent *)e);
  QVar2 = QPointF::toPoint(&local_28);
  this->pressPos = QVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorWell::mousePressEvent(QMouseEvent *e)
{
    oldCurrent = QPoint(selectedRow(), selectedColumn());
    QWellArray::mousePressEvent(e);
    mousePressed = true;
    pressPos = e->position().toPoint();
}